

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# syntax_gtest_tests.cpp
# Opt level: O3

void __thiscall
test::syntax_gtest_tests::iu_GTestSyntaxTest_x_iutest_x_NE_COLLECTIONS_Test::Body
          (iu_GTestSyntaxTest_x_iutest_x_NE_COLLECTIONS_Test *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  int *in_stack_fffffffffffffdb0;
  allocator<char> local_241;
  AssertionResult iutest_ar;
  AssertionHelper local_218;
  int a [5];
  int local_1d4 [3];
  int b [5];
  int local_1b4;
  undefined1 local_1b0 [392];
  
  a[0] = 0;
  a[1] = 1;
  a[2] = 2;
  a[3] = 3;
  a[4] = 4;
  b[0] = 0;
  b[1] = 2;
  b[2] = 2;
  b[3] = 3;
  b[4] = 4;
  iuutil::CmpHelperNeCollections<int*,int*>
            (&iutest_ar,(iuutil *)0x337803,"a+(sizeof(a)/sizeof(a[0]))","b",
             "b+(sizeof(b)/sizeof(b[0]))",(char *)a,local_1d4,b,&local_1b4,in_stack_fffffffffffffdb0
            );
  if (iutest_ar.m_result == false) {
    memset((iu_global_format_stringstream *)local_1b0,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)local_1b0);
    local_218.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p._0_4_ = 5;
    iutest::detail::iuStreamMessage::operator<<((iuStreamMessage *)local_1b0,(int *)&local_218);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_218,iutest_ar.m_message._M_dataplus._M_p,&local_241);
    local_218.m_part_result.super_iuCodeMessage.m_file =
         "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/syntax_gtest_tests.cpp"
    ;
    local_218.m_part_result.super_iuCodeMessage.m_line = 0x54;
    local_218.m_part_result.super_iuCodeMessage._44_4_ = 2;
    iutest::AssertionHelper::OnFixed(&local_218,(Fixed *)local_1b0,false);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT44(local_218.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p._4_4_,
                    local_218.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p._0_4_) !=
        &local_218.m_part_result.super_iuCodeMessage.m_message.field_2) {
      operator_delete((undefined1 *)
                      CONCAT44(local_218.m_part_result.super_iuCodeMessage.m_message._M_dataplus.
                               _M_p._4_4_,
                               local_218.m_part_result.super_iuCodeMessage.m_message._M_dataplus.
                               _M_p._0_4_),
                      local_218.m_part_result.super_iuCodeMessage.m_message.field_2.
                      _M_allocated_capacity + 1);
    }
    std::__cxx11::stringstream::~stringstream((stringstream *)local_1b0);
    std::ios_base::~ios_base((ios_base *)(local_1b0 + 0x80));
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)iutest_ar.m_message._M_dataplus._M_p == &iutest_ar.m_message.field_2) {
      return;
    }
  }
  else {
    paVar1 = &iutest_ar.m_message.field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)iutest_ar.m_message._M_dataplus._M_p != paVar1) {
      in_stack_fffffffffffffdb0 = (int *)0x314163;
      operator_delete(iutest_ar.m_message._M_dataplus._M_p,
                      iutest_ar.m_message.field_2._M_allocated_capacity + 1);
    }
    iuutil::CmpHelperNeCollections<int*,int*>
              (&iutest_ar,(iuutil *)0x337803,"a+(sizeof(a)/sizeof(a[0]))","b",
               "b+(sizeof(b)/sizeof(b[0]))",(char *)a,local_1d4,b,&local_1b4,
               in_stack_fffffffffffffdb0);
    if (iutest_ar.m_result == false) {
      memset((iu_global_format_stringstream *)local_1b0,0,0x188);
      iutest::iu_global_format_stringstream::iu_global_format_stringstream
                ((iu_global_format_stringstream *)local_1b0);
      local_218.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p._0_4_ = 5;
      iutest::detail::iuStreamMessage::operator<<((iuStreamMessage *)local_1b0,(int *)&local_218);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_218,iutest_ar.m_message._M_dataplus._M_p,&local_241);
      local_218.m_part_result.super_iuCodeMessage.m_file =
           "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/syntax_gtest_tests.cpp"
      ;
      local_218.m_part_result.super_iuCodeMessage.m_line = 0x56;
      local_218.m_part_result.super_iuCodeMessage._44_4_ = 1;
      iutest::AssertionHelper::OnFixed(&local_218,(Fixed *)local_1b0,false);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)CONCAT44(local_218.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p._4_4_,
                      local_218.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p._0_4_)
          != &local_218.m_part_result.super_iuCodeMessage.m_message.field_2) {
        operator_delete((undefined1 *)
                        CONCAT44(local_218.m_part_result.super_iuCodeMessage.m_message._M_dataplus.
                                 _M_p._4_4_,
                                 local_218.m_part_result.super_iuCodeMessage.m_message._M_dataplus.
                                 _M_p._0_4_),
                        local_218.m_part_result.super_iuCodeMessage.m_message.field_2.
                        _M_allocated_capacity + 1);
      }
      std::__cxx11::stringstream::~stringstream((stringstream *)local_1b0);
      in_stack_fffffffffffffdb0 = (int *)0x31425d;
      std::ios_base::~ios_base((ios_base *)(local_1b0 + 0x80));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)iutest_ar.m_message._M_dataplus._M_p != paVar1) {
      in_stack_fffffffffffffdb0 = (int *)0x314274;
      operator_delete(iutest_ar.m_message._M_dataplus._M_p,
                      iutest_ar.m_message.field_2._M_allocated_capacity + 1);
    }
    iuutil::CmpHelperNeCollections<int*,int*>
              (&iutest_ar,(iuutil *)0x337803,"a+(sizeof(a)/sizeof(a[0]))","b",
               "b+(sizeof(b)/sizeof(b[0]))",(char *)a,local_1d4,b,&local_1b4,
               in_stack_fffffffffffffdb0);
    if (iutest_ar.m_result == false) {
      memset((iu_global_format_stringstream *)local_1b0,0,0x188);
      iutest::iu_global_format_stringstream::iu_global_format_stringstream
                ((iu_global_format_stringstream *)local_1b0);
      local_218.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p._0_4_ = 5;
      iutest::detail::iuStreamMessage::operator<<((iuStreamMessage *)local_1b0,(int *)&local_218);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_218,iutest_ar.m_message._M_dataplus._M_p,&local_241);
      local_218.m_part_result.super_iuCodeMessage.m_file =
           "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/syntax_gtest_tests.cpp"
      ;
      local_218.m_part_result.super_iuCodeMessage.m_line = 0x58;
      local_218.m_part_result.super_iuCodeMessage._44_4_ = 0xffffffff;
      iutest::AssertionHelper::OnFixed(&local_218,(Fixed *)local_1b0,false);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)CONCAT44(local_218.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p._4_4_,
                      local_218.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p._0_4_)
          != &local_218.m_part_result.super_iuCodeMessage.m_message.field_2) {
        operator_delete((undefined1 *)
                        CONCAT44(local_218.m_part_result.super_iuCodeMessage.m_message._M_dataplus.
                                 _M_p._4_4_,
                                 local_218.m_part_result.super_iuCodeMessage.m_message._M_dataplus.
                                 _M_p._0_4_),
                        local_218.m_part_result.super_iuCodeMessage.m_message.field_2.
                        _M_allocated_capacity + 1);
      }
      std::__cxx11::stringstream::~stringstream((stringstream *)local_1b0);
      in_stack_fffffffffffffdb0 = (int *)0x31436e;
      std::ios_base::~ios_base((ios_base *)(local_1b0 + 0x80));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)iutest_ar.m_message._M_dataplus._M_p != paVar1) {
      in_stack_fffffffffffffdb0 = (int *)0x314385;
      operator_delete(iutest_ar.m_message._M_dataplus._M_p,
                      iutest_ar.m_message.field_2._M_allocated_capacity + 1);
    }
    iuutil::CmpHelperNeCollections<int*,int*>
              (&iutest_ar,(iuutil *)0x337803,"a+(sizeof(a)/sizeof(a[0]))","b",
               "b+(sizeof(b)/sizeof(b[0]))",(char *)a,local_1d4,b,&local_1b4,
               in_stack_fffffffffffffdb0);
    if (iutest_ar.m_result == false) {
      memset((iu_global_format_stringstream *)local_1b0,0,0x188);
      iutest::iu_global_format_stringstream::iu_global_format_stringstream
                ((iu_global_format_stringstream *)local_1b0);
      local_218.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p._0_4_ = 5;
      iutest::detail::iuStreamMessage::operator<<((iuStreamMessage *)local_1b0,(int *)&local_218);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_218,iutest_ar.m_message._M_dataplus._M_p,&local_241);
      local_218.m_part_result.super_iuCodeMessage.m_file =
           "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/syntax_gtest_tests.cpp"
      ;
      local_218.m_part_result.super_iuCodeMessage.m_line = 0x5a;
      local_218.m_part_result.super_iuCodeMessage._44_4_ = 0xfffffffd;
      iutest::AssertionHelper::OnFixed(&local_218,(Fixed *)local_1b0,false);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)CONCAT44(local_218.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p._4_4_,
                      local_218.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p._0_4_)
          != &local_218.m_part_result.super_iuCodeMessage.m_message.field_2) {
        operator_delete((undefined1 *)
                        CONCAT44(local_218.m_part_result.super_iuCodeMessage.m_message._M_dataplus.
                                 _M_p._4_4_,
                                 local_218.m_part_result.super_iuCodeMessage.m_message._M_dataplus.
                                 _M_p._0_4_),
                        local_218.m_part_result.super_iuCodeMessage.m_message.field_2.
                        _M_allocated_capacity + 1);
      }
      std::__cxx11::stringstream::~stringstream((stringstream *)local_1b0);
      std::ios_base::~ios_base((ios_base *)(local_1b0 + 0x80));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)iutest_ar.m_message._M_dataplus._M_p == paVar1) {
      return;
    }
  }
  operator_delete(iutest_ar.m_message._M_dataplus._M_p,
                  iutest_ar.m_message.field_2._M_allocated_capacity + 1);
  return;
}

Assistant:

TEST(GTestSyntaxTest, NE_COLLECTIONS)
{
    int a[] = { 0, 1, 2, 3, 4 };
    int b[] = { 0, 2, 2, 3, 4 };

    if( int size = (sizeof(a)/sizeof(a[0])) )
        ASSERT_NE_COLLECTIONS(a, a+(sizeof(a)/sizeof(a[0])), b, b+(sizeof(b)/sizeof(b[0]))) << size;
    if( int size = (sizeof(a)/sizeof(a[0])) )
        EXPECT_NE_COLLECTIONS(a, a+(sizeof(a)/sizeof(a[0])), b, b+(sizeof(b)/sizeof(b[0]))) << size;
    if( int size = (sizeof(a)/sizeof(a[0])) )
        INFORM_NE_COLLECTIONS(a, a+(sizeof(a)/sizeof(a[0])), b, b+(sizeof(b)/sizeof(b[0]))) << size;
    if( int size = (sizeof(a)/sizeof(a[0])) )
        ASSUME_NE_COLLECTIONS(a, a+(sizeof(a)/sizeof(a[0])), b, b+(sizeof(b)/sizeof(b[0]))) << size;
}